

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int64_t read_sleb128(dwarf_buf *buf)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  byte unaff_BL;
  uint uVar5;
  char local_108 [8];
  char b [200];
  
  b[0xc0] = '\0';
  b[0xc1] = '\0';
  b[0xc2] = '\0';
  b[0xc3] = '\0';
  b[0xc4] = '\0';
  b[0xc5] = '\0';
  b[0xc6] = '\0';
  b[199] = '\0';
  uVar5 = 0;
  bVar2 = false;
  while( true ) {
    pbVar1 = buf->buf;
    iVar3 = advance(buf,1);
    if (iVar3 != 0) {
      unaff_BL = *pbVar1;
      if (uVar5 < 0x40) {
        b._192_8_ = b._192_8_ | (ulong)(unaff_BL & 0x7f) << ((byte)uVar5 & 0x3f);
      }
      else {
        if (!bVar2) {
          snprintf(local_108,200,"%s in %s at %d","signed LEB128 overflows uint64_t",buf->name,
                   (ulong)(uint)(*(int *)&buf->buf - *(int *)&buf->start));
          (*buf->error_callback)(buf->data,local_108,0);
        }
        bVar2 = true;
      }
      uVar5 = uVar5 + 7;
    }
    if (iVar3 == 0) break;
    if (-1 < (char)unaff_BL) {
      uVar4 = -1L << ((byte)uVar5 & 0x3f);
      if (0x3f < uVar5) {
        uVar4 = 0;
      }
      if (unaff_BL < 0x40) {
        uVar4 = 0;
      }
      return uVar4 | b._192_8_;
    }
  }
  return 0;
}

Assistant:

static int64_t
read_sleb128 (struct dwarf_buf *buf)
{
  uint64_t val;
  unsigned int shift;
  int overflow;
  unsigned char b;

  val = 0;
  shift = 0;
  overflow = 0;
  do
    {
      const unsigned char *p;

      p = buf->buf;
      if (!advance (buf, 1))
	return 0;
      b = *p;
      if (shift < 64)
	val |= ((uint64_t) (b & 0x7f)) << shift;
      else if (!overflow)
	{
	  dwarf_buf_error (buf, "signed LEB128 overflows uint64_t", 0);
	  overflow = 1;
	}
      shift += 7;
    }
  while ((b & 0x80) != 0);

  if ((b & 0x40) != 0 && shift < 64)
    val |= ((uint64_t) -1) << shift;

  return (int64_t) val;
}